

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O1

void cnn::TensorTools::Randomize(Tensor *val,real scale)

{
  float *pfVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ushort uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  int iVar20;
  undefined1 extraout_var [60];
  
  uVar8 = (ulong)(val->d).nd;
  if (uVar8 == 0) {
    iVar20 = 1;
  }
  else {
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar9 = 0;
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar18 = vmovdqa64_avx512f(auVar15);
      auVar15 = vpbroadcastq_avx512f();
      auVar19 = vporq_avx512f(auVar15,auVar16);
      auVar15 = vporq_avx512f(auVar15,auVar17);
      uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
      bVar7 = (byte)uVar5;
      uVar12 = CONCAT11(bVar7,bVar6);
      auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])((val->d).d + uVar9));
      auVar19._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
      auVar19._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
      auVar19._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
      auVar19._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
      auVar19._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
      auVar19._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
      auVar19._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
      auVar19._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
      auVar19._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
      auVar19._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
      auVar19._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
      auVar19._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
      auVar19._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
      auVar19._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
      auVar19._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
      auVar19._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
      auVar15 = vpmulld_avx512f(auVar19,auVar18);
      uVar9 = uVar9 + 0x10;
    } while ((uVar8 + 0xf & 0xfffffffffffffff0) != uVar9);
    auVar14 = vmovdqa32_avx512f(auVar15);
    auVar15._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
    bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar15._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
    bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar15._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
    bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar15._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
    bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar15._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
    bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar15._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
    bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar15._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
    bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar15._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
    auVar15._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
    bVar2 = (bool)(bVar7 >> 1 & 1);
    auVar15._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
    bVar2 = (bool)(bVar7 >> 2 & 1);
    auVar15._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
    bVar2 = (bool)(bVar7 >> 3 & 1);
    auVar15._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
    bVar2 = (bool)(bVar7 >> 4 & 1);
    auVar15._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
    bVar2 = (bool)(bVar7 >> 5 & 1);
    auVar15._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
    bVar2 = (bool)(bVar7 >> 6 & 1);
    auVar15._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
    auVar15._60_4_ =
         (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar15,1);
    auVar14 = vpmulld_avx512f(auVar15,ZEXT3264(auVar13));
    auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    iVar20 = auVar3._0_4_;
  }
  uVar10 = iVar20 * (val->d).bd;
  if (uVar10 != 0) {
    pfVar1 = val->v;
    lVar11 = 0;
    do {
      auVar14._0_4_ =
           std::
           generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (rndeng);
      auVar14._4_60_ = extraout_var;
      auVar3 = vfmsub132ss_fma(auVar14._0_16_,ZEXT416((uint)scale),ZEXT416((uint)(scale + scale)));
      *(int *)((long)pfVar1 + lVar11) = auVar3._0_4_;
      lVar11 = lVar11 + 4;
    } while ((ulong)uVar10 << 2 != lVar11);
  }
  return;
}

Assistant:

void TensorTools::Randomize(Tensor& val, real scale) {
  uniform_real_distribution<real> distribution(-scale,scale);
  auto b = [&] {return distribution(*rndeng);};
#if HAVE_CUDA
  float* t = new float[val.d.size()];
  generate(t, t + val.d.size(), b);
  CUDA_CHECK(cudaMemcpy(val.v, t, sizeof(real) * val.d.size(), cudaMemcpyHostToDevice));
  delete[] t;
#else
  generate(val.v, val.v + val.d.size(), b);
#endif
}